

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O2

char * eread(char *fmt,char *buf,size_t nbuf,int flag,...)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  int color;
  char in_AL;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  buffer *pbVar10;
  list *plVar11;
  ulong uVar12;
  undefined1 *__ptr;
  list *plVar13;
  char *pcVar14;
  line *plVar15;
  mgwin *pmVar16;
  bool bVar17;
  uint uVar18;
  ulong uVar19;
  size_t sVar20;
  long lVar21;
  buffer **ppbVar22;
  list *plVar23;
  int iVar24;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  bool bVar30;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_198 [32];
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined1 local_e8 [8];
  va_list ap;
  size_t local_70;
  int local_68;
  uint local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  plVar15 = maclcur;
  ap[0].overflow_arg_area = local_198;
  if (in_AL != '\0') {
    local_168 = in_XMM0_Qa;
    local_158 = in_XMM1_Qa;
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
    local_118 = in_XMM5_Qa;
    local_108 = in_XMM6_Qa;
    local_f8 = in_XMM7_Qa;
  }
  ap[0]._0_8_ = &stack0x00000008;
  local_e8._0_4_ = 0x20;
  local_e8._4_4_ = 0x30;
  local_178 = in_R8;
  local_170 = in_R9;
  if (inmacro == 0) {
    if (((flag & 8U) == 0) && (ttrow == nrow + -1)) {
      eputc(' ');
    }
    else {
      ttcolor(1);
      ttmove(nrow + -1,0);
      epresf = 1;
    }
    eformat(fmt,(__va_list_tag *)local_e8);
    sVar20 = 0;
    if ((flag & 0x20U) != 0) {
      if (buf == (char *)0x0) {
        return (char *)0x0;
      }
      eputs(buf);
      sVar20 = strlen(buf);
    }
    tteeol();
    ttflush();
    bVar17 = true;
    bVar30 = false;
    local_50 = 0;
    local_58 = 0;
    local_54 = 0;
    local_48 = sVar20 & 0xffffffff;
    local_38 = sVar20;
    local_70 = nbuf;
    local_40 = buf;
LAB_0010bb43:
    uVar19 = local_48 & 0xffffffff;
LAB_0010bb46:
    do {
      local_48 = uVar19 & 0xffffffff;
      iVar25 = (int)local_38;
LAB_0010bb5b:
      uVar19 = (ulong)local_50;
      do {
        iVar5 = getkey(0);
        uVar27 = local_38;
        uVar8 = local_48;
        color = tthue;
        iVar7 = ttcol;
        iVar24 = ttrow;
        uVar18 = (uint)local_38;
        if (iVar5 == 9 && (flag & 7U) != 0) {
          if (!bVar30) {
            iVar25 = complt(flag,9,local_40,local_70,uVar18,&local_4c);
            bVar30 = iVar25 != 0;
            local_38 = uVar27 & 0xffffffff;
            if (bVar30) {
              local_38 = (ulong)(local_4c + uVar18);
            }
            uVar28 = (uint)local_48;
            if (bVar30) {
              uVar28 = local_4c + uVar18;
            }
            uVar19 = (ulong)uVar28;
            goto LAB_0010bb46;
          }
          ttflush();
          pbVar10 = bfind("*Completions*",1);
          iVar25 = bclear(pbVar10);
          pcVar9 = local_40;
          uVar19 = local_48;
          bVar30 = true;
          bVar17 = false;
          if (iVar25 == 0) goto LAB_0010bb43;
          pbVar10->b_flag = pbVar10->b_flag | 0x10;
          if ((flag & 2U) != 0) {
            ppbVar22 = &bheadp;
            plVar13 = (list *)0x0;
            goto LAB_0010c506;
          }
          if ((flag & 1U) == 0) {
            if ((flag & 4U) == 0) {
              panic("broken complt call: flags");
            }
            local_40[(int)local_48] = '\0';
            plVar13 = make_file_list(local_40);
            pcVar14 = strrchr(pcVar9,0x2f);
            if (pcVar14 != (char *)0x0) {
              local_68 = ((int)pcVar14 - (int)pcVar9) + 1;
              plVar11 = plVar13;
              goto LAB_0010c598;
            }
          }
          else {
            local_40[(int)local_48] = '\0';
            plVar13 = complete_function_list(local_40);
            pcVar9 = local_40;
          }
          local_68 = 0;
          plVar11 = plVar13;
          goto LAB_0010c598;
        }
        uVar28 = (uint)local_48;
        if ((int)local_54 < 1) goto LAB_0010bc68;
        bVar3 = true;
        uVar26 = local_54;
        if (local_58 == local_54) {
          lVar21 = *(long *)(*(long *)(_cur_term + 0x20) + 0x278);
          cVar1 = *(char *)(lVar21 + (ulong)local_58);
          uVar26 = local_58;
          if (iVar5 == cVar1 && cVar1 != '\0') {
            bVar3 = false;
            bVar30 = *(char *)(lVar21 + 1 + (ulong)local_58) == '\0';
            if (bVar30) {
              uVar26 = 0;
            }
            local_58 = local_58 + 1;
            if (bVar30) {
              iVar5 = 2;
            }
          }
        }
        if (local_50 == uVar26) {
          lVar21 = *(long *)(*(long *)(_cur_term + 0x20) + 0x298);
          iVar24 = (int)*(char *)(lVar21 + uVar19);
          if ((iVar24 != 0) && (iVar5 == iVar24)) {
            uVar6 = local_50 + 1;
            uVar26 = local_50;
            local_50 = uVar6;
            if (*(char *)(lVar21 + 1 + uVar19) == '\0') {
              local_54 = 0;
              goto switchD_0010bc8f_caseD_6;
            }
            break;
          }
        }
        bVar30 = false;
        local_54 = 0;
      } while (bVar3);
      if (uVar26 != 0) goto code_r0x0010bc55;
      local_54 = 0;
LAB_0010bc68:
      if (0x1b < iVar5 - 1U) {
        if (iVar5 == 0x7f) goto switchD_0010bc8f_caseD_8;
        goto switchD_0010bc8f_caseD_3;
      }
      uVar19 = local_48 & 0xffffffff;
      switch(iVar5) {
      case 1:
        for (; 0 < (int)uVar19; uVar19 = uVar19 - 1) {
          if ((cinfo[(byte)local_40[uVar19 - 1]] & 8U) != 0) {
            ttputc(8);
            ttcol = ttcol + -1;
          }
          ttputc(8);
          ttcol = ttcol + -1;
        }
        uVar19 = (ulong)((int)uVar28 >> 0x1f & uVar28);
        goto LAB_0010c177;
      case 2:
        bVar30 = false;
        uVar19 = local_48 & 0xffffffff;
        if (0 < (int)uVar28) {
          if ((cinfo[(byte)local_40[uVar28 - 1]] & 8U) != 0) {
            ttputc(8);
            ttcol = ttcol + -1;
          }
          ttputc(8);
          ttcol = ttcol + -1;
          ttflush();
          bVar30 = false;
          uVar19 = (ulong)(uVar28 - 1);
        }
        break;
      default:
        goto switchD_0010bc8f_caseD_3;
      case 4:
        bVar30 = false;
        uVar19 = local_38 & 0xffffffff;
        if (uVar18 != uVar28) {
          tteeol();
          iVar24 = ttcol;
          iVar25 = ttrow;
          uVar18 = (int)local_38 - 1;
          uVar8 = uVar8 & 0xffffffff;
          while (iVar7 = (int)uVar8, local_4c = iVar7, iVar7 < (int)uVar18) {
            local_40[iVar7] = local_40[(long)iVar7 + 1];
            eputc(local_40[iVar7]);
            uVar8 = (ulong)(iVar7 + 1);
          }
          ttmove(iVar25,iVar24);
          ttflush();
          bVar30 = false;
          uVar19 = local_48 & 0xffffffff;
          local_38 = (ulong)uVar18;
        }
        break;
      case 5:
        for (uVar19 = (ulong)(int)uVar28; (long)uVar19 < (long)(int)uVar18; uVar19 = uVar19 + 1) {
          eputc(local_40[uVar19]);
        }
LAB_0010c177:
        ttflush();
        bVar30 = false;
        break;
      case 6:
        goto switchD_0010bc8f_caseD_6;
      case 7:
        eputc('\a');
        local_40 = (char *)0x0;
        ctrlg(8,0);
        ttflush();
        goto LAB_0010c92e;
      case 8:
switchD_0010bc8f_caseD_8:
        bVar30 = false;
        uVar19 = 0;
        if (uVar28 != 0) {
          bVar2 = local_40[(long)(int)uVar28 + -1];
          ttputc(8);
          iVar25 = ttcol + -1;
          if ((cinfo[bVar2] & 8U) != 0) {
            ttcol = iVar25;
            ttputc(8);
            iVar25 = ttcol + -1;
          }
          uVar19 = (long)(int)uVar28 - 1;
          uVar18 = (int)local_38 - 1;
          uVar8 = (ulong)uVar18;
          local_38 = CONCAT44(local_38._4_4_,ttrow);
          uVar27 = uVar19 & 0xffffffff;
          ttcol = iVar25;
          while (iVar24 = (int)uVar27, local_4c = iVar24, iVar24 < (int)uVar18) {
            local_40[iVar24] = local_40[(long)iVar24 + 1];
            eputc(local_40[iVar24]);
            uVar27 = (ulong)(iVar24 + 1);
          }
          ttputc(0x20);
          if ((cinfo[bVar2] & 8U) != 0) {
            ttputc(0x20);
            ttputc(8);
          }
          ttputc(8);
          ttmove((int)local_38,iVar25);
          goto LAB_0010c405;
        }
        break;
      case 10:
      case 0xd:
        if (iVar25 == 0 && (flag & 0x40U) == 0) {
          ctrlg(8,0);
          ttflush();
          return (char *)0x0;
        }
        if ((flag & 1U) != 0) {
          iVar24 = complt(flag,0xd,local_40,local_70,uVar18,&local_4c);
          bVar30 = false;
          if (iVar24 == 0) goto LAB_0010bb5b;
          iVar25 = 0;
          if (0 < local_4c) {
            iVar25 = local_4c;
          }
          uVar18 = iVar25 + (int)local_38;
        }
        uVar19 = local_48;
        local_40[(int)uVar18] = '\0';
        if ((flag & 0x10U) != 0) {
          ttputc(0xd);
          ttflush();
        }
        if (macrodef != 0) {
          plVar15 = lalloc((int)uVar19);
          if (plVar15 == (line *)0x0) goto LAB_0010c96a;
          plVar15->l_fp = maclcur->l_fp;
          maclcur->l_fp = plVar15;
          plVar15->l_bp = maclcur;
          maclcur = plVar15;
          memmove(plVar15->l_text,local_40,(long)(int)uVar19);
        }
LAB_0010c92e:
        if (bVar17) {
          return local_40;
        }
        pbVar10 = bfind("*Completions*",1);
        pmVar16 = popbuf(pbVar10,1);
        if (pmVar16 != (mgwin *)0x0) {
          if ((pmVar16->w_flag & 1U) != 0) {
            curwp = pmVar16;
            delwind(8,1);
            return local_40;
          }
          killbuffer(pbVar10);
          return local_40;
        }
        return local_40;
      case 0xb:
        kdelete();
        lVar29 = (long)(int)local_38;
        for (lVar21 = (long)(int)local_48; local_4c = (int)lVar21, lVar21 < lVar29;
            lVar21 = lVar21 + 1) {
          kinsert((int)local_40[lVar21],1);
        }
        tteeol();
        ttflush();
        bVar30 = false;
        uVar19 = local_48 & 0xffffffff;
        local_38 = local_48 & 0xffffffff;
        break;
      case 0x11:
      case 0x1c:
        iVar5 = getkey(0);
switchD_0010bc8f_caseD_3:
        uVar19 = local_38;
        iVar25 = (int)local_38;
        iVar24 = iVar25 + 1;
        pcVar9 = local_40;
        if (buf == (char *)0x0) {
          if (local_70 <= (ulong)(long)iVar24) {
            local_70 = (size_t)(iVar25 * 2 + 0x10);
            pcVar9 = (char *)realloc(local_40,local_70);
            if (pcVar9 == (char *)0x0) goto LAB_0010c96a;
          }
        }
        else if (local_70 <= (ulong)(long)iVar24) {
          dobeep();
          ewprintf("Line too long. Press Control-g to escape.");
LAB_0010c002:
          bVar30 = false;
          uVar19 = local_48 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 & 0xffffffff;
        while( true ) {
          local_4c = (int)uVar19;
          if (local_4c <= (int)local_48) break;
          pcVar9[local_4c] = pcVar9[(long)local_4c + -1];
          uVar19 = (ulong)(local_4c - 1);
        }
        local_38 = CONCAT44(local_38._4_4_,iVar24);
        uVar18 = (int)local_48 + 1;
        pcVar9[(int)local_48] = (char)iVar5;
        eputc((char)iVar5);
        iVar7 = ttcol;
        iVar24 = ttrow;
        local_48 = (ulong)uVar18;
        for (lVar21 = (long)(int)uVar18; local_4c = (int)lVar21, lVar21 <= iVar25;
            lVar21 = lVar21 + 1) {
          eputc(pcVar9[lVar21]);
        }
        ttmove(iVar24,iVar7);
        ttflush();
        bVar30 = false;
        uVar19 = local_48 & 0xffffffff;
        local_38 = local_38 & 0xffffffff;
        local_40 = pcVar9;
        break;
      case 0x15:
      case 0x18:
        lVar21 = (long)(int)uVar28;
        while (lVar29 = lVar21 + -1, lVar21 != 0) {
          ttputc(8);
          ttputc(0x20);
          ttputc(8);
          ttcol = ttcol + -1;
          lVar4 = lVar21 + -1;
          lVar21 = lVar29;
          if ((cinfo[(byte)local_40[lVar4]] & 8U) != 0) {
            ttputc(8);
            ttputc(0x20);
            ttputc(8);
            ttcol = ttcol + -1;
          }
        }
        uVar18 = (int)local_38 - (int)local_48;
        ttflush();
        bVar30 = false;
        uVar19 = 0;
        local_38 = (ulong)uVar18;
        break;
      case 0x17:
        uVar26 = (int)uVar28 >> 0x1f & uVar28;
        goto LAB_0010c09f;
      case 0x19:
        local_4c = 0;
        uVar19 = local_48 & 0xffffffff;
        local_38 = (long)(int)uVar18;
        goto LAB_0010befc;
      case 0x1b:
        local_50 = 1;
        local_58 = 1;
        local_54 = 1;
        goto LAB_0010c002;
      }
    } while( true );
  }
  uVar19 = (ulong)maclcur->l_used;
  if (buf == (char *)0x0) {
    buf = (char *)malloc(uVar19 + 1);
    if (buf != (char *)0x0) goto LAB_0010c842;
  }
  else if (uVar19 < nbuf) {
LAB_0010c842:
    memmove(buf,plVar15->l_text,uVar19);
    buf[maclcur->l_used] = '\0';
    maclcur = maclcur->l_fp;
    return buf;
  }
  return (char *)0x0;
LAB_0010c506:
  ppbVar22 = (buffer **)(((buffer *)ppbVar22)->b_list).l_p.l_wp;
  uVar19 = local_48;
  if ((buffer *)ppbVar22 == (buffer *)0x0) goto LAB_0010c590;
  plVar11 = (list *)malloc(0x10);
  uVar19 = local_48;
  if (plVar11 == (list *)0x0) goto LAB_0010c566;
  (plVar11->l_p).l_nxt = plVar13;
  pcVar9 = strdup((((buffer *)ppbVar22)->b_list).l_name);
  plVar11->l_name = pcVar9;
  plVar13 = plVar11;
  goto LAB_0010c506;
LAB_0010c566:
  while (plVar13 != (list *)0x0) {
    plVar11 = (plVar13->l_p).l_nxt;
    free(plVar13->l_name);
    free(plVar13);
    plVar13 = plVar11;
  }
  plVar13 = (list *)0x0;
LAB_0010c590:
  local_68 = 0;
  pcVar9 = local_40;
  plVar11 = plVar13;
LAB_0010c598:
  for (; plVar23 = plVar13, plVar13 != (list *)0x0; plVar13 = (plVar13->l_p).l_nxt) {
    while (plVar23 = (plVar23->l_p).l_nxt, plVar23 != (list *)0x0) {
      pcVar9 = plVar13->l_name;
      pcVar14 = plVar23->l_name;
      iVar25 = strcmp(pcVar9,pcVar14);
      if (0 < iVar25) {
        plVar13->l_name = pcVar14;
        plVar23->l_name = pcVar9;
      }
    }
    pcVar9 = local_40;
    uVar19 = local_48;
  }
  uVar8 = 0;
  uVar27 = 0;
  plVar13 = plVar11;
  if (0 < (int)uVar19) {
    uVar27 = uVar19 & 0xffffffff;
  }
  for (; plVar13 != (list *)0x0; plVar13 = (plVar13->l_p).l_nxt) {
    for (uVar19 = 0;
        (uVar12 = uVar27, uVar27 != uVar19 &&
        (uVar12 = uVar19, pcVar9[uVar19] == plVar13->l_name[uVar19])); uVar19 = uVar19 + 1) {
    }
    uVar19 = uVar8;
    if ((int)uVar12 == (int)local_48) {
      sVar20 = strlen(plVar13->l_name);
      pcVar9 = local_40;
      uVar19 = sVar20 & 0xffffffff;
      if ((int)sVar20 < (int)uVar8) {
        uVar19 = uVar8;
      }
    }
    uVar8 = uVar19;
  }
  iVar5 = ((int)uVar8 - local_68) + 1;
  iVar25 = ncol;
  if (ncol <= iVar5) {
    iVar25 = iVar5;
  }
  uVar18 = iVar25 + 1;
  __ptr = (undefined1 *)malloc((long)(int)uVar18);
  if (__ptr == (undefined1 *)0x0) {
    free_file_list(plVar11);
  }
  else {
    *__ptr = 0;
    uVar28 = 0;
    pcVar9 = local_40;
    for (plVar13 = plVar11; plVar13 != (list *)0x0; plVar13 = (plVar13->l_p).l_nxt) {
      for (uVar19 = 0;
          (uVar8 = uVar27, uVar27 != uVar19 &&
          (uVar8 = uVar19, pcVar9[uVar19] == plVar13->l_name[uVar19])); uVar19 = uVar19 + 1) {
      }
      if ((int)uVar8 == (int)local_48) {
        if (ncol < (int)(uVar28 + iVar5)) {
          uVar28 = 0;
          addlinef(pbVar10,"%s",__ptr);
          *__ptr = 0;
        }
        uVar19 = strlcat(__ptr,plVar13->l_name + local_68,(long)(int)uVar18);
        uVar28 = uVar28 + iVar5;
        pcVar9 = local_40;
        if ((uVar28 < uVar18) && (uVar19 < (ulong)(long)(int)uVar28)) {
          sVar20 = strlen(plVar13->l_name + local_68);
          memset(__ptr + uVar19,0x20,(long)iVar5 - sVar20);
          __ptr[(int)uVar28] = 0;
          pcVar9 = local_40;
        }
      }
    }
    if (0 < (int)uVar28) {
      addlinef(pbVar10,"%s",__ptr);
    }
    free(__ptr);
    free_file_list(plVar11);
    popbuftop(pbVar10,1);
    update(2);
    ttmove(iVar24,iVar7);
    ttcolor(color);
    ttflush();
  }
  bVar17 = false;
  goto LAB_0010bb43;
code_r0x0010bc55:
  local_54 = uVar26 + 1;
  bVar30 = false;
  goto LAB_0010bb5b;
LAB_0010befc:
  iVar25 = local_4c;
  local_4c = local_4c + 1;
  iVar25 = kremove(iVar25);
  if ((iVar25 < 0) || (iVar25 == *curbp->b_nlchr)) goto LAB_0010c177;
  uVar8 = local_38 + 1;
  pcVar9 = local_40;
  if (buf == (char *)0x0) {
    if (local_70 <= uVar8) {
      local_70 = local_38 * 2 + 0x10;
      pcVar9 = (char *)realloc(local_40,local_70);
      if (pcVar9 == (char *)0x0) {
LAB_0010c96a:
        if ((buf == (char *)0x0) && (local_40 != (char *)0x0)) {
          free(local_40);
        }
        dobeep();
        ewprintf("Out of memory");
        return &veread_emptyval;
      }
    }
  }
  else if (local_70 <= uVar8) {
    dobeep();
    bVar30 = false;
    ewprintf("Line too long. Press Control-g to escape.");
    goto LAB_0010bb46;
  }
  iVar24 = (int)uVar19;
  for (uVar19 = local_38; (long)iVar24 < (long)uVar19; uVar19 = uVar19 - 1) {
    pcVar9[uVar19] = pcVar9[uVar19 - 1];
  }
  uVar19 = (ulong)(iVar24 + 1U);
  pcVar9[iVar24] = (char)iVar25;
  eputc((char)iVar25);
  iVar25 = ttrow;
  local_40 = (char *)CONCAT44(local_40._4_4_,ttcol);
  for (lVar21 = (long)(int)(iVar24 + 1U); lVar21 <= (long)local_38; lVar21 = lVar21 + 1) {
    eputc(pcVar9[lVar21]);
  }
  ttmove(iVar25,(int)local_40);
  local_40 = pcVar9;
  local_38 = uVar8;
  goto LAB_0010befc;
LAB_0010c09f:
  uVar6 = (uint)uVar19;
  if ((int)uVar6 < 1) goto LAB_0010c338;
  uVar8 = local_38;
  if ((cinfo[(byte)local_40[uVar19 - 1]] & 1U) != 0) goto LAB_0010c366;
  ttputc(8);
  ttputc(0x20);
  ttputc(8);
  ttcol = ttcol + -1;
  if ((cinfo[(byte)local_40[uVar19 - 1]] & 8U) != 0) {
    ttputc(8);
    ttputc(0x20);
    ttputc(8);
    ttcol = ttcol + -1;
  }
  local_38 = (ulong)((int)local_38 - 1);
  uVar19 = uVar19 - 1;
  goto LAB_0010c09f;
LAB_0010c338:
  uVar8 = (ulong)((uVar18 + uVar26) - uVar28);
  uVar6 = uVar26;
LAB_0010c366:
  uVar18 = (int)uVar6 >> 0x1f & uVar6;
  uVar19 = (ulong)uVar18;
  local_38 = CONCAT44(local_38._4_4_,((int)uVar8 + uVar18) - uVar6);
  for (uVar27 = (ulong)uVar6; 0 < (int)uVar27; uVar27 = uVar27 - 1) {
    if ((cinfo[(byte)local_40[uVar27 - 1]] & 1U) == 0) {
      uVar19 = uVar27 & 0xffffffff;
      goto LAB_0010c405;
    }
    ttputc(8);
    ttputc(0x20);
    ttputc(8);
    ttcol = ttcol + -1;
    if ((cinfo[(byte)local_40[uVar27 - 1]] & 8U) != 0) {
      ttputc(8);
      ttputc(0x20);
      ttputc(8);
      ttcol = ttcol + -1;
    }
    uVar8 = (ulong)((int)uVar8 - 1);
  }
  uVar8 = local_38 & 0xffffffff;
LAB_0010c405:
  ttflush();
  bVar30 = false;
  local_38 = uVar8;
  goto LAB_0010bb46;
switchD_0010bc8f_caseD_6:
  bVar30 = false;
  uVar19 = local_48 & 0xffffffff;
  if ((int)uVar28 < (int)uVar18) goto LAB_0010c434;
  goto LAB_0010bb46;
LAB_0010c434:
  eputc(local_40[(int)uVar28]);
  ttflush();
  bVar30 = false;
  local_48 = (ulong)(uVar28 + 1);
  goto LAB_0010bb43;
}

Assistant:

char *
eread(const char *fmt, char *buf, size_t nbuf, int flag, ...)
{
	va_list	 ap;
	char	*rep;

	va_start(ap, flag);
	rep = veread(fmt, buf, nbuf, flag, ap);
	va_end(ap);
	return (rep);
}